

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O0

double __thiscall
NetworkNS::cb3D_integrator::bonded_force_calculation(cb3D_integrator *this,bool stress_calc)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference psVar4;
  reference ppsVar5;
  reference psVar6;
  int iVar7;
  double dVar8;
  _Self local_a8;
  _Self local_a0;
  iterator it;
  double gradb [3];
  double local_78;
  double grada [3];
  double local_58;
  double sep_vec [3];
  int tagb3;
  int tagb;
  int taga3;
  int taga;
  uint j;
  uint i_1;
  uint i;
  double fenergy;
  bool stress_calc_local;
  cb3D_integrator *this_local;
  
  _i_1 = 0.0;
  for (j = 0; j < this->dofs_3N; j = j + 1) {
    this->bd_f[j] = 0.0;
  }
  if (stress_calc) {
    for (taga = 0; (uint)taga < this->dofs; taga = taga + 1) {
      for (taga3 = 0; (uint)taga3 < 6; taga3 = taga3 + 1) {
        this->bd_stress[(uint)taga][(uint)taga3] = 0.0;
      }
    }
  }
  local_a0._M_node =
       (_List_node_base *)
       std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::begin
                 (&this->cur_bd_net->network->strands);
  while( true ) {
    local_a8._M_node =
         (_List_node_base *)
         std::__cxx11::list<sStrand,_std::allocator<sStrand>_>::end
                   (&this->cur_bd_net->network->strands);
    bVar1 = std::operator!=(&local_a0,&local_a8);
    if (!bVar1) break;
    psVar4 = std::_List_iterator<sStrand>::operator*(&local_a0);
    ppsVar5 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&psVar4->pEnds,0);
    iVar2 = (*ppsVar5)->Id + -1;
    iVar3 = iVar2 * 3;
    psVar4 = std::_List_iterator<sStrand>::operator*(&local_a0);
    ppsVar5 = std::vector<sNode_*,_std::allocator<sNode_*>_>::operator[](&psVar4->pEnds,1);
    iVar7 = (*ppsVar5)->Id + -1;
    sep_vec[2]._4_4_ = iVar7 * 3;
    local_58 = this->bd_x[sep_vec[2]._4_4_] - this->bd_x[iVar3];
    sep_vec[0] = this->bd_x[sep_vec[2]._4_4_ + 1] - this->bd_x[iVar3 + 1];
    sep_vec[1] = this->bd_x[sep_vec[2]._4_4_ + 2] - this->bd_x[iVar3 + 2];
    Domain::minimum_image(this->cur_bd_net->domain,&local_58,sep_vec,sep_vec + 1);
    psVar4 = std::_List_iterator<sStrand>::operator*(&local_a0);
    psVar6 = std::_List_iterator<sStrand>::operator*(&local_a0);
    dVar8 = f_gaussian(&local_58,&psVar4->spring_coeff,&psVar6->sq_end_to_end,&this->bd_temp,
                       &local_78,(double *)&it);
    _i_1 = dVar8 + _i_1;
    this->bd_f[iVar3] = local_78 + this->bd_f[iVar3];
    this->bd_f[iVar3 + 1] = grada[0] + this->bd_f[iVar3 + 1];
    this->bd_f[iVar3 + 2] = grada[1] + this->bd_f[iVar3 + 2];
    this->bd_f[sep_vec[2]._4_4_] = (double)it._M_node + this->bd_f[sep_vec[2]._4_4_];
    this->bd_f[sep_vec[2]._4_4_ + 1] = gradb[0] + this->bd_f[sep_vec[2]._4_4_ + 1];
    this->bd_f[sep_vec[2]._4_4_ + 2] = gradb[1] + this->bd_f[sep_vec[2]._4_4_ + 2];
    if (stress_calc) {
      *this->bd_stress[iVar2] = local_58 * 0.5 * local_78 + *this->bd_stress[iVar2];
      this->bd_stress[iVar2][1] = sep_vec[0] * 0.5 * grada[0] + this->bd_stress[iVar2][1];
      this->bd_stress[iVar2][2] = sep_vec[1] * 0.5 * grada[1] + this->bd_stress[iVar2][2];
      this->bd_stress[iVar2][3] = local_58 * 0.5 * grada[0] + this->bd_stress[iVar2][3];
      this->bd_stress[iVar2][4] = local_58 * 0.5 * grada[1] + this->bd_stress[iVar2][4];
      this->bd_stress[iVar2][5] = sep_vec[0] * 0.5 * grada[1] + this->bd_stress[iVar2][5];
      *this->bd_stress[iVar7] = local_58 * 0.5 * local_78 + *this->bd_stress[iVar7];
      this->bd_stress[iVar7][1] = sep_vec[0] * 0.5 * grada[0] + this->bd_stress[iVar7][1];
      this->bd_stress[iVar7][2] = sep_vec[1] * 0.5 * grada[1] + this->bd_stress[iVar7][2];
      this->bd_stress[iVar7][3] = local_58 * 0.5 * grada[0] + this->bd_stress[iVar7][3];
      this->bd_stress[iVar7][4] = local_58 * 0.5 * grada[1] + this->bd_stress[iVar7][4];
      this->bd_stress[iVar7][5] = sep_vec[0] * 0.5 * grada[1] + this->bd_stress[iVar7][5];
    }
    std::_List_iterator<sStrand>::operator++(&local_a0);
  }
  return _i_1;
}

Assistant:

double cb3D_integrator::bonded_force_calculation(bool stress_calc) {

      double fenergy = 0.0; 
              
      // Initialize the forces to zero.
      for (unsigned int i = 0; i < dofs_3N; i++)
         bd_f[i] = 0.0;
      
      // Initialize the stresses to zero, if we have been asked for stress calculation:
      if (stress_calc)
         for (unsigned int i = 0; i < dofs; i++)
            for (unsigned int j = 0; j < 6; j++)
               bd_stress[i][j] = 0.0;
      

      int taga, taga3, tagb, tagb3;
      //double *sep_vec = (double*)malloc(3*sizeof(double));
      //double *grada   = (double*)malloc(3*sizeof(double));
      //double *gradb   = (double*)malloc(3*sizeof(double));

      double sep_vec[3], grada[3], gradb[3];
      
      for (std::list<tStrand>::iterator it = cur_bd_net->network->strands.begin();
              it != cur_bd_net->network->strands.end(); ++it) {
         
         /* Ask for the tags of the nodes connected to the current strand. */
         taga  = (*it).pEnds[0]->Id - 1;
         taga3 = 3*taga; 
         tagb =  (*it).pEnds[1]->Id - 1;
         tagb3 = 3*tagb;
         
         /* Form the "strand" vector, based on the x vector coming from
          * the minimizer. */
         sep_vec[0] = bd_x[tagb3 + 0] - bd_x[taga3 + 0];
         sep_vec[1] = bd_x[tagb3 + 1] - bd_x[taga3 + 1];
         sep_vec[2] = bd_x[tagb3 + 2] - bd_x[taga3 + 2];
         
         /* Apply minimum image convention. */
         cur_bd_net->domain->minimum_image(sep_vec[0], sep_vec[1], sep_vec[2]);

#ifdef FENE_SLS
         if ((*it).slip_spring)
            fenergy += f_fene( sep_vec, (*it).spring_coeff, 
                               (*it).sq_end_to_end, bd_temp, grada, gradb);
         else
#endif
         /* Calculate the spring's contribution to the free energy of the system.*/
         fenergy += f_gaussian( sep_vec, (*it).spring_coeff, 
                                (*it).sq_end_to_end, bd_temp, grada, gradb);
         
         // Accumulate the forces of the first atom:
         bd_f[taga3 + 0] += grada[0];
         bd_f[taga3 + 1] += grada[1];
         bd_f[taga3 + 2] += grada[2];
         // Accumulate the forces of the second atom:
         bd_f[tagb3 + 0] += gradb[0];
         bd_f[tagb3 + 1] += gradb[1];
         bd_f[tagb3 + 2] += gradb[2];

         /** The stress tensor of the atom @f$ i @f$, @f$\sigma_{i,\rm a,b} @f$ is given by the 
          *  following formula, where @f$\rm a@f$ and @f$\rm b @f$ take on values @f$ x @f$, 
          *  @f$ y @f$, @f$ z @f$ to generate the six components of the symmetric tensor:
          *  @f[ \sigma_{i,\rm a,b} = -\frac{1}{2}\sum_{j=1}^{N_{\rm b}(i)}
          *      \left(r_{i,a} - r_{j,a}\right)^{\rm min.im.} F_{ij,b}^{\rm min.im.}  @f]
          *  where @f$N_{\rm b}(i)@f$ stands for the number of bonds atom @f$ i @f$ participates to.
          */ 
         if (stress_calc) {
            bd_stress[taga][0] += 0.5 * sep_vec[0] * grada[0]; // xx
            bd_stress[taga][1] += 0.5 * sep_vec[1] * grada[1]; // yy
            bd_stress[taga][2] += 0.5 * sep_vec[2] * grada[2]; // zz
            bd_stress[taga][3] += 0.5 * sep_vec[0] * grada[1]; // xy
            bd_stress[taga][4] += 0.5 * sep_vec[0] * grada[2]; // xz
            bd_stress[taga][5] += 0.5 * sep_vec[1] * grada[2]; // yz

            bd_stress[tagb][0] += 0.5 * sep_vec[0] * grada[0];
            bd_stress[tagb][1] += 0.5 * sep_vec[1] * grada[1];
            bd_stress[tagb][2] += 0.5 * sep_vec[2] * grada[2];
            bd_stress[tagb][3] += 0.5 * sep_vec[0] * grada[1];
            bd_stress[tagb][4] += 0.5 * sep_vec[0] * grada[2];
            bd_stress[tagb][5] += 0.5 * sep_vec[1] * grada[2];
         }
      }

      
      
      
      return (fenergy);
   }